

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

int __thiscall ncnn::Gemm_x86_fma::create_pipeline_int8(Gemm_x86_fma *this,Option *opt)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte *in_RSI;
  long in_RDI;
  bool bVar5;
  Mat BT_tile;
  int max_kk_1;
  int max_jj;
  int k_1;
  int j;
  int ppj_1;
  int nn_N;
  int TILE_K_1;
  int TILE_N_1;
  int TILE_M_1;
  int K_1;
  int N;
  Mat AT_tile;
  int max_kk;
  int max_ii;
  int k;
  int i;
  int ppj;
  int w_shift_count;
  bool has_w_shift;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int K;
  int M;
  Mat *m_1;
  Mat *m;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffa24;
  size_t in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  int _w;
  Mat *in_stack_fffffffffffffa40;
  undefined8 in_stack_fffffffffffffa50;
  void **ppvVar7;
  int in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  Mat *in_stack_fffffffffffffa60;
  Mat *in_stack_fffffffffffffa68;
  Mat *in_stack_fffffffffffffa70;
  Mat *in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa88;
  int in_stack_fffffffffffffa8c;
  undefined8 in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  int *in_stack_fffffffffffffaa0;
  Mat *in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffab4;
  undefined8 *in_stack_fffffffffffffab8;
  Mat *in_stack_fffffffffffffac0;
  Mat *in_stack_fffffffffffffac8;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  bool local_4f9;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined4 local_4d8;
  long *local_4d0;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined8 local_4b0;
  void *local_4a8;
  int *local_4a0;
  long local_498;
  undefined4 local_490;
  long *local_488;
  undefined4 local_480;
  int local_47c;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  long local_468;
  int local_460;
  int local_45c;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  int local_440;
  int local_43c [2];
  int local_434;
  int local_430;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined4 local_408;
  Allocator *local_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined8 local_3e0;
  Mat local_3d8;
  int local_38c;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  int local_378;
  int local_374;
  undefined4 local_370;
  bool local_369;
  int local_368;
  int local_364 [2];
  int local_35c;
  int local_358;
  int local_354;
  byte *local_350;
  undefined8 *local_338;
  Mat *local_328;
  undefined8 *local_318;
  void **local_308;
  long *local_2f8;
  long *local_2f0;
  undefined1 local_2e5;
  int local_2e4;
  long *local_2e0;
  undefined8 *local_2d8;
  undefined1 local_2c5;
  int local_2c4;
  long *local_2c0;
  undefined8 *local_2b8;
  undefined4 local_2a8;
  int local_2a4;
  undefined8 *local_2a0;
  void **local_298;
  undefined4 local_290;
  int local_28c;
  undefined8 *local_288;
  Mat *local_280;
  int local_248;
  undefined4 local_244;
  void **local_240;
  undefined8 *local_220;
  int local_208;
  undefined4 local_204;
  Mat *local_200;
  undefined8 *local_1e0;
  int local_1d8;
  undefined4 local_1d4;
  undefined8 *local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  undefined8 *local_1c0;
  int local_1b8;
  undefined4 local_1b4;
  int *local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  int local_188;
  undefined4 local_184;
  undefined8 *local_180;
  long *local_178;
  long *local_170;
  Allocator *local_168;
  int local_15c;
  size_t local_158;
  long local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  long *local_130;
  undefined4 local_124;
  long local_120;
  long local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  undefined4 local_f4;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  Allocator *local_d8;
  int local_cc;
  size_t local_c8;
  void *local_c0;
  undefined4 local_b8;
  int local_b4;
  Mat *local_b0;
  long *local_a8;
  undefined4 local_9c;
  long local_98;
  void *local_90;
  undefined4 local_88;
  int local_84;
  void **local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_48;
  void *local_28;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  local_350 = in_RSI;
  if (*(int *)(in_RDI + 0xe0) != 0) {
    local_354 = *(int *)(in_RDI + 0xec);
    local_358 = *(int *)(in_RDI + 0xf4);
    uVar6 = *(undefined4 *)(in_RSI + 4);
    get_optimal_tile_mnk_int8
              ((int)((ulong)in_stack_fffffffffffffa90 >> 0x20),(int)in_stack_fffffffffffffa90,
               in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88,
               (int)((ulong)in_stack_fffffffffffffa80 >> 0x20),(int)in_stack_fffffffffffffa80,
               in_stack_fffffffffffffaa0,(int *)in_stack_fffffffffffffaa8,
               (int *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               (int)in_stack_fffffffffffffab8);
    local_368 = (local_354 + local_35c + -1) / local_35c;
    local_369 = false;
    if (3 < local_364[0]) {
      iVar1 = cpu_support_x86_avx512_vnni();
      local_4f9 = true;
      if (iVar1 == 0) {
        iVar1 = cpu_support_x86_avx_vnni();
        local_4f9 = iVar1 != 0;
      }
      local_369 = local_4f9;
      iVar1 = cpu_support_x86_avx_vnni_int8();
      if (iVar1 != 0) {
        local_369 = false;
      }
    }
    iVar1 = (int)((ulong)in_stack_fffffffffffffa30 >> 0x20);
    _w = (int)((ulong)in_stack_fffffffffffffa38 >> 0x20);
    if ((local_369 & 1U) == 0) {
      Mat::create(in_stack_fffffffffffffa40,_w,(int)in_stack_fffffffffffffa38,iVar1,
                  in_stack_fffffffffffffa28,(Allocator *)CONCAT44(in_stack_fffffffffffffa24,uVar6));
    }
    else {
      if (local_35c < 0x10) {
        if (local_35c < 8) {
          if (local_35c < 4) {
            local_508 = 1;
            if (1 < local_35c) {
              local_508 = 2;
            }
          }
          else {
            local_508 = 4;
          }
          local_504 = local_508;
        }
        else {
          local_504 = 8;
        }
        local_500 = local_504;
      }
      else {
        local_500 = 0x10;
      }
      local_370 = local_500;
      Mat::create(in_stack_fffffffffffffa40,_w,(int)in_stack_fffffffffffffa38,iVar1,
                  in_stack_fffffffffffffa28,(Allocator *)CONCAT44(in_stack_fffffffffffffa24,uVar6));
    }
    local_2f0 = (long *)(in_RDI + 0x248);
    bVar5 = true;
    if (*local_2f0 != 0) {
      bVar5 = *(long *)(in_RDI + 0x288) * (long)*(int *)(in_RDI + 0x280) == 0;
      local_178 = local_2f0;
    }
    if (bVar5) {
      return -100;
    }
    for (local_374 = 0; iVar1 = (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
        local_374 < local_368; local_374 = local_374 + 1) {
      local_378 = local_374 * local_35c;
      for (local_37c = 0; local_37c < local_358; local_37c = local_364[0] + local_37c) {
        local_384 = local_354 - local_378;
        piVar2 = std::min<int>(&local_384,&local_35c);
        local_380 = *piVar2;
        local_38c = local_358 - local_37c;
        piVar2 = std::min<int>(&local_38c,local_364);
        local_388 = *piVar2;
        local_2c0 = (long *)(in_RDI + 0x248);
        local_2c4 = local_378 / local_35c;
        local_2b8 = &local_420;
        local_13c = *(int *)(in_RDI + 0x274);
        local_140 = *(int *)(in_RDI + 0x278);
        local_144 = *(undefined4 *)(in_RDI + 0x27c);
        local_150 = *local_2c0 +
                    *(long *)(in_RDI + 0x288) * (long)local_2c4 * *(long *)(in_RDI + 600);
        local_158 = *(size_t *)(in_RDI + 600);
        local_15c = *(int *)(in_RDI + 0x260);
        local_168 = *(Allocator **)(in_RDI + 0x268);
        local_138 = &local_420;
        local_e0 = (long)local_13c * (long)local_140 * local_158;
        local_28c = local_37c / local_364[0];
        local_280 = &local_3d8;
        local_288 = &local_420;
        local_c0 = (void *)(local_150 + (long)local_13c * (long)local_28c * local_158);
        in_stack_fffffffffffffac0 = &local_3d8;
        local_3d8.cstep = (size_t)local_13c;
        in_stack_fffffffffffffab8 = &local_420;
        local_3d8.c = 1;
        local_3d8.d = 1;
        local_3d8.h = 1;
        local_3d8.dims = 2;
        local_3d8.refcount = (int *)0x0;
        local_b8 = 1;
        local_e4 = 0x10;
        local_290 = 1;
        local_2c5 = 1;
        local_420 = 0;
        local_410 = 0;
        local_408 = 0;
        local_3f8 = 0;
        local_3f4 = 0;
        local_3f0 = 0;
        local_3ec = 0;
        local_3e8 = 0;
        local_3e0 = 0;
        local_418 = 0;
        local_338 = in_stack_fffffffffffffab8;
        local_1e0 = in_stack_fffffffffffffab8;
        local_d8 = local_168;
        local_cc = local_15c;
        local_c8 = local_158;
        local_b4 = local_13c;
        local_b0 = in_stack_fffffffffffffac0;
        local_400 = local_168;
        local_3d8.data = local_c0;
        local_3d8.elemsize = local_158;
        local_3d8.elempack = local_15c;
        local_3d8.allocator = local_168;
        local_3d8.w = local_13c;
        if (*(int *)(in_RDI + 0xd8) == 0) {
          ncnn::pack_A_tile_int8
                    (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                     (int)((ulong)in_stack_fffffffffffffa68 >> 0x20),(int)in_stack_fffffffffffffa68,
                     (int)((ulong)in_stack_fffffffffffffa60 >> 0x20),(int)in_stack_fffffffffffffa60)
          ;
        }
        else {
          transpose_pack_A_tile_int8
                    (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
                     in_stack_fffffffffffffa58,(int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                     (int)in_stack_fffffffffffffa50);
        }
        in_stack_fffffffffffffaa8 = &local_3d8;
        local_328 = in_stack_fffffffffffffaa8;
        local_200 = in_stack_fffffffffffffaa8;
        if (local_3d8.refcount != (int *)0x0) {
          local_204 = 0xffffffff;
          LOCK();
          local_208 = *local_3d8.refcount;
          *local_3d8.refcount = *local_3d8.refcount + -1;
          UNLOCK();
          if (local_208 == 1) {
            if (local_3d8.allocator == (Allocator *)0x0) {
              local_48 = local_3d8.data;
              if (local_3d8.data != (void *)0x0) {
                free(local_3d8.data);
              }
            }
            else {
              (*(local_3d8.allocator)->_vptr_Allocator[3])(local_3d8.allocator,local_3d8.data);
            }
          }
        }
        in_stack_fffffffffffffaa8->data = (void *)0x0;
        in_stack_fffffffffffffaa8->elemsize = 0;
        in_stack_fffffffffffffaa8->elempack = 0;
        in_stack_fffffffffffffaa8->dims = 0;
        in_stack_fffffffffffffaa8->w = 0;
        in_stack_fffffffffffffaa8->h = 0;
        in_stack_fffffffffffffaa8->d = 0;
        in_stack_fffffffffffffaa8->c = 0;
        in_stack_fffffffffffffaa8->cstep = 0;
        in_stack_fffffffffffffaa8->refcount = (int *)0x0;
      }
    }
    if ((*local_350 & 1) != 0) {
      in_stack_fffffffffffffaa0 = (int *)(in_RDI + 0x120);
      local_1b0 = in_stack_fffffffffffffaa0;
      if (*(long *)(in_RDI + 0x128) != 0) {
        piVar2 = *(int **)(in_RDI + 0x128);
        local_1b4 = 0xffffffff;
        LOCK();
        local_1b8 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (local_1b8 == 1) {
          if (*(long *)(in_RDI + 0x140) == 0) {
            local_70 = *(void **)in_stack_fffffffffffffaa0;
            if (local_70 != (void *)0x0) {
              free(local_70);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x140) + 0x18))
                      (*(long **)(in_RDI + 0x140),*(undefined8 *)in_stack_fffffffffffffaa0);
          }
        }
      }
      in_stack_fffffffffffffaa0[0] = 0;
      in_stack_fffffffffffffaa0[1] = 0;
      in_stack_fffffffffffffaa0[4] = 0;
      in_stack_fffffffffffffaa0[5] = 0;
      in_stack_fffffffffffffaa0[6] = 0;
      in_stack_fffffffffffffaa0[10] = 0;
      in_stack_fffffffffffffaa0[0xb] = 0;
      in_stack_fffffffffffffaa0[0xc] = 0;
      in_stack_fffffffffffffaa0[0xd] = 0;
      in_stack_fffffffffffffaa0[0xe] = 0;
      in_stack_fffffffffffffaa0[0x10] = 0;
      in_stack_fffffffffffffaa0[0x11] = 0;
      in_stack_fffffffffffffaa0[2] = 0;
      in_stack_fffffffffffffaa0[3] = 0;
    }
  }
  if (*(int *)(in_RDI + 0xe4) != 0) {
    local_430 = *(int *)(in_RDI + 0xf0);
    local_434 = *(int *)(in_RDI + 0xf4);
    uVar6 = *(undefined4 *)(local_350 + 4);
    get_optimal_tile_mnk_int8
              ((int)((ulong)in_stack_fffffffffffffa90 >> 0x20),(int)in_stack_fffffffffffffa90,
               in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88,
               (int)((ulong)in_stack_fffffffffffffa80 >> 0x20),(int)in_stack_fffffffffffffa80,
               in_stack_fffffffffffffaa0,(int *)in_stack_fffffffffffffaa8,
               (int *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               (int)in_stack_fffffffffffffab8);
    local_444 = (local_430 + local_43c[0] + -1) / local_43c[0];
    Mat::create(in_stack_fffffffffffffa40,(int)((ulong)in_stack_fffffffffffffa38 >> 0x20),
                (int)in_stack_fffffffffffffa38,iVar1,in_stack_fffffffffffffa28,
                (Allocator *)CONCAT44(in_stack_fffffffffffffa24,uVar6));
    local_2f8 = (long *)(in_RDI + 0x290);
    iVar1 = CONCAT13(1,(int3)in_stack_fffffffffffffa9c);
    if (*local_2f8 != 0) {
      iVar1 = CONCAT13(*(long *)(in_RDI + 0x2d0) * (long)*(int *)(in_RDI + 0x2c8) == 0,
                       (int3)in_stack_fffffffffffffa9c);
      local_170 = local_2f8;
    }
    if ((char)((uint)iVar1 >> 0x18) != '\0') {
      return -100;
    }
    for (local_448 = 0; local_448 < local_444; local_448 = local_448 + 1) {
      local_44c = local_448 * local_43c[0];
      for (local_450 = 0; local_450 < local_434; local_450 = local_440 + local_450) {
        local_458 = local_430 - local_44c;
        piVar2 = std::min<int>(&local_458,local_43c);
        local_454 = *piVar2;
        local_460 = local_434 - local_450;
        piVar2 = std::min<int>(&local_460,&local_440);
        local_45c = *piVar2;
        local_2e0 = (long *)(in_RDI + 0x290);
        local_2e4 = local_44c / local_43c[0];
        local_2d8 = &local_4f0;
        local_104 = *(int *)(in_RDI + 700);
        local_108 = *(int *)(in_RDI + 0x2c0);
        local_10c = *(undefined4 *)(in_RDI + 0x2c4);
        local_118 = *local_2e0 +
                    *(long *)(in_RDI + 0x2d0) * (long)local_2e4 * *(long *)(in_RDI + 0x2a0);
        local_120 = *(long *)(in_RDI + 0x2a0);
        local_124 = *(undefined4 *)(in_RDI + 0x2a8);
        local_130 = *(long **)(in_RDI + 0x2b0);
        local_100 = &local_4f0;
        local_f0 = (long)local_104 * (long)local_108 * local_120;
        local_2a4 = local_450 / local_440;
        local_298 = &local_4a8;
        local_2a0 = &local_4f0;
        local_90 = (void *)(local_118 + (long)local_104 * (long)local_2a4 * local_120);
        local_80 = &local_4a8;
        local_468 = (long)local_104;
        local_318 = &local_4f0;
        local_470 = 1;
        local_474 = 1;
        local_478 = 1;
        local_480 = 2;
        local_4a0 = (int *)0x0;
        local_88 = 1;
        local_f4 = 0x10;
        local_2a8 = 1;
        local_2e5 = 1;
        local_4f0 = 0;
        local_4e0 = 0;
        local_4d8 = 0;
        local_4c8 = 0;
        local_4c4 = 0;
        local_4c0 = 0;
        local_4bc = 0;
        local_4b8 = 0;
        local_4b0 = 0;
        local_4e8 = 0;
        local_220 = local_318;
        local_a8 = local_130;
        local_9c = local_124;
        local_98 = local_120;
        local_84 = local_104;
        local_4d0 = local_130;
        local_4a8 = local_90;
        local_498 = local_120;
        local_490 = local_124;
        local_488 = local_130;
        local_47c = local_104;
        if (*(int *)(in_RDI + 0xdc) == 0) {
          transpose_pack_B_tile_int8
                    ((Mat *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                     in_stack_fffffffffffffaa8,(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),
                     (int)in_stack_fffffffffffffaa0,iVar1,in_stack_fffffffffffffa98);
        }
        else {
          pack_B_tile_int8(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                           (int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                           (int)in_stack_fffffffffffffab8,in_stack_fffffffffffffab4,
                           in_stack_fffffffffffffab0);
        }
        ppvVar7 = &local_4a8;
        local_308 = ppvVar7;
        local_240 = ppvVar7;
        if (local_4a0 != (int *)0x0) {
          local_244 = 0xffffffff;
          LOCK();
          local_248 = *local_4a0;
          *local_4a0 = *local_4a0 + -1;
          UNLOCK();
          if (local_248 == 1) {
            if (local_488 == (long *)0x0) {
              local_28 = local_4a8;
              if (local_4a8 != (void *)0x0) {
                free(local_4a8);
              }
            }
            else {
              (**(code **)(*local_488 + 0x18))(local_488,local_4a8);
            }
          }
        }
        *ppvVar7 = (void *)0x0;
        ppvVar7[2] = (void *)0x0;
        *(undefined4 *)(ppvVar7 + 3) = 0;
        *(undefined4 *)(ppvVar7 + 5) = 0;
        *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
        *(undefined4 *)(ppvVar7 + 6) = 0;
        *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
        *(undefined4 *)(ppvVar7 + 7) = 0;
        ppvVar7[8] = (void *)0x0;
        ppvVar7[1] = (void *)0x0;
      }
    }
    if ((*local_350 & 1) != 0) {
      puVar3 = (undefined8 *)(in_RDI + 0x168);
      local_1c0 = puVar3;
      if (*(long *)(in_RDI + 0x170) != 0) {
        piVar2 = *(int **)(in_RDI + 0x170);
        local_1c4 = 0xffffffff;
        LOCK();
        local_1c8 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (local_1c8 == 1) {
          if (*(long *)(in_RDI + 0x188) == 0) {
            local_68 = (void *)*puVar3;
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))(*(long **)(in_RDI + 0x188),*puVar3);
          }
        }
      }
      *puVar3 = 0;
      *(undefined8 *)(in_RDI + 0x178) = 0;
      *(undefined4 *)(in_RDI + 0x180) = 0;
      *(undefined4 *)(in_RDI + 400) = 0;
      *(undefined4 *)(in_RDI + 0x194) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(undefined4 *)(in_RDI + 0x19c) = 0;
      *(undefined4 *)(in_RDI + 0x1a0) = 0;
      *(undefined8 *)(in_RDI + 0x1a8) = 0;
      *(undefined8 *)(in_RDI + 0x170) = 0;
    }
  }
  if ((*(int *)(in_RDI + 0xe8) != 0) && (*(int *)(in_RDI + 0xf8) != -1)) {
    local_1a0 = (undefined8 *)(in_RDI + 0x1b0);
    puVar3 = (undefined8 *)(in_RDI + 0x2d8);
    local_198 = puVar3;
    if (puVar3 != local_1a0) {
      if (*(long *)(in_RDI + 0x1b8) != 0) {
        piVar2 = *(int **)(in_RDI + 0x1b8);
        local_1a4 = 1;
        LOCK();
        local_1a8 = *piVar2;
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      puVar4 = puVar3;
      local_180 = puVar3;
      if (*(long *)(in_RDI + 0x2e0) != 0) {
        piVar2 = *(int **)(in_RDI + 0x2e0);
        local_184 = 0xffffffff;
        LOCK();
        local_188 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (local_188 == 1) {
          if (*(long *)(in_RDI + 0x2f8) == 0) {
            local_78 = (void *)*puVar3;
            if (local_78 != (void *)0x0) {
              free(local_78);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x2f8) + 0x18))(*(long **)(in_RDI + 0x2f8),*puVar3);
          }
        }
      }
      *puVar3 = 0;
      puVar3[2] = 0;
      *(undefined4 *)(puVar3 + 3) = 0;
      *(undefined4 *)(puVar3 + 5) = 0;
      *(undefined4 *)((long)puVar3 + 0x2c) = 0;
      *(undefined4 *)(puVar3 + 6) = 0;
      *(undefined4 *)((long)puVar3 + 0x34) = 0;
      *(undefined4 *)(puVar3 + 7) = 0;
      puVar3[8] = 0;
      puVar3[1] = 0;
      *puVar4 = *local_1a0;
      puVar4[1] = local_1a0[1];
      puVar4[2] = local_1a0[2];
      *(undefined4 *)(puVar4 + 3) = *(undefined4 *)(local_1a0 + 3);
      puVar4[4] = local_1a0[4];
      *(undefined4 *)(puVar4 + 5) = *(undefined4 *)(local_1a0 + 5);
      *(undefined4 *)((long)puVar4 + 0x2c) = *(undefined4 *)((long)local_1a0 + 0x2c);
      *(undefined4 *)(puVar4 + 6) = *(undefined4 *)(local_1a0 + 6);
      *(undefined4 *)((long)puVar4 + 0x34) = *(undefined4 *)((long)local_1a0 + 0x34);
      *(undefined4 *)(puVar4 + 7) = *(undefined4 *)(local_1a0 + 7);
      puVar4[8] = local_1a0[8];
      puVar3 = puVar4;
    }
    if ((*local_350 & 1) != 0) {
      puVar4 = (undefined8 *)(in_RDI + 0x1b0);
      if (*(long *)(in_RDI + 0x1b8) != 0) {
        piVar2 = *(int **)(in_RDI + 0x1b8);
        local_1d4 = 0xffffffff;
        LOCK();
        local_1d8 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (local_1d8 == 1) {
          local_1d0 = puVar4;
          local_190 = puVar3;
          if (*(long *)(in_RDI + 0x1d0) == 0) {
            local_60 = (void *)*puVar4;
            if (local_60 != (void *)0x0) {
              free(local_60);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x18))(*(long **)(in_RDI + 0x1d0),*puVar4);
          }
        }
      }
      *puVar4 = 0;
      puVar4[2] = 0;
      *(undefined4 *)(puVar4 + 3) = 0;
      *(undefined4 *)(puVar4 + 5) = 0;
      *(undefined4 *)((long)puVar4 + 0x2c) = 0;
      *(undefined4 *)(puVar4 + 6) = 0;
      *(undefined4 *)((long)puVar4 + 0x34) = 0;
      *(undefined4 *)(puVar4 + 7) = 0;
      puVar4[8] = 0;
      puVar4[1] = 0;
    }
  }
  if (((*(int *)(in_RDI + 0xe0) != 0) || (*(int *)(in_RDI + 0xe4) != 0)) ||
     (*(int *)(in_RDI + 0xe8) != 0)) {
    *(undefined4 *)(in_RDI + 0x244) = *(undefined4 *)(local_350 + 4);
  }
  return 0;
}

Assistant:

int Gemm_x86_fma::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}